

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_hydration(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  uint number;
  int iVar1;
  int *piVar2;
  long in_RCX;
  void *arg1;
  long in_RDX;
  bool spring;
  OBJ_DATA *obj;
  int heal;
  CHAR_DATA *victim;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  uint3 in_stack_ffffffffffffffc4;
  uint uVar3;
  long local_38;
  int local_2c;
  
  uVar3 = (uint)in_stack_ffffffffffffffc4;
  for (local_38 = *(long *)(*(long *)(in_RDX + 0xa8) + 0x20); local_38 != 0;
      local_38 = *(long *)(local_38 + 8)) {
    if (*(short *)(local_38 + 0x98) == 0x19) {
      uVar3 = CONCAT13(1,(int3)uVar3);
    }
  }
  number = (int)*(short *)(*(long *)(in_RDX + 0xa8) + 0x150) - 1;
  arg1 = (void *)(ulong)number;
  switch(arg1) {
  case (void *)0x0:
    local_2c = dice(number,in_stack_ffffffffffffffac);
    break;
  case (void *)0x1:
    local_2c = dice(number,in_stack_ffffffffffffffac);
    if ((uVar3 & 0x1000000) != 0) {
      local_2c = (int)((float)local_2c * 1.5);
    }
    break;
  case (void *)0x2:
    local_2c = dice(number,in_stack_ffffffffffffffac);
    if ((uVar3 & 0x1000000) != 0) {
      local_2c = (int)((float)local_2c * 1.5);
    }
    break;
  case (void *)0x3:
    local_2c = dice(number,in_stack_ffffffffffffffac);
    if ((uVar3 & 0x1000000) != 0) {
      local_2c = (int)((float)local_2c * 1.5);
    }
    break;
  case (void *)0x4:
    local_2c = dice(number,in_stack_ffffffffffffffac);
    if ((uVar3 & 0x1000000) != 0) {
      local_2c = (int)((float)local_2c * 1.5);
    }
    break;
  case (void *)0x6:
    local_2c = dice(number,in_stack_ffffffffffffffac);
    break;
  case (void *)0x7:
    local_2c = dice(number,in_stack_ffffffffffffffac);
    break;
  case (void *)0x8:
    local_2c = dice(number,in_stack_ffffffffffffffac);
    break;
  case (void *)0x9:
    local_2c = dice(number,in_stack_ffffffffffffffac);
    break;
  case (void *)0xa:
    local_2c = dice(number,in_stack_ffffffffffffffac);
    break;
  case (void *)0xb:
    local_2c = 0;
    break;
  case (void *)0xc:
    local_2c = 0;
    break;
  default:
    local_2c = dice(number,in_stack_ffffffffffffffac);
    break;
  case (void *)0xe:
    dice(number,in_stack_ffffffffffffffac);
  case (void *)0x5:
    local_2c = dice((int)arg1,in_stack_ffffffffffffffac);
  }
  if ((((*(short *)(*(long *)(*(long *)(in_RDX + 0xa8) + 0x30) + 0x15a) == 3) &&
       (*(short *)(*(long *)(in_RDX + 0xa8) + 0x150) != 6)) &&
      (*(short *)(*(long *)(in_RDX + 0xa8) + 0x150) != 7)) &&
     (*(short *)(*(long *)(in_RDX + 0xa8) + 0x150) != 8)) {
    iVar1 = dice((int)arg1,in_stack_ffffffffffffffac);
    local_2c = iVar1 + local_2c;
  }
  if (in_RCX == in_RDX) {
    act((char *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),arg1,
        (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  }
  else {
    act((char *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),arg1,
        (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  }
  if (local_2c == 0) {
    act((char *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),arg1,
        (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  }
  else if (local_2c < 0x1f) {
    act((char *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),arg1,
        (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  }
  else if (local_2c < 0x51) {
    act((char *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),arg1,
        (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  }
  else {
    act((char *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),arg1,
        (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  }
  piVar2 = std::min<int>((int *)&stack0xffffffffffffffc0,(int *)&stack0xffffffffffffffbc);
  *(int *)(in_RCX + 0x158) = *piVar2;
  return;
}

Assistant:

void spell_hydration(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int heal = 0;
	OBJ_DATA *obj;
	bool spring = false;

	for (obj = ch->in_room->contents; obj; obj = obj->next_content)
	{
		if (obj->item_type == ITEM_FOUNTAIN)
			spring = true;
	}

	switch (ch->in_room->sector_type)
	{
		case SECT_CITY:
			heal = dice(4, 10);
			break;
		case SECT_DESERT:
			heal = dice(4, 10);
			break;
		case SECT_ROAD:
			heal = dice(4, 10);
			break;
		case SECT_AIR:
			heal = dice(4, 10);
			break;
		case SECT_INSIDE:
			heal = dice(4, 10);
			break;
		case SECT_HILLS:
			heal = dice(6, 10);

			if (spring)
				heal = (int)((float)heal * 1.5);

			break;
		case SECT_MOUNTAIN:
			heal = dice(6, 10);

			if (spring)
				heal = (int)((float)heal * 1.5);

			break;
		case SECT_FIELD:
			heal = dice(8, 10);

			if (spring)
				heal = (int)((float)heal * 1.5);

			break;
		case SECT_FOREST:
			heal = dice(8, 10);

			if (spring)
				heal = (int)((float)heal * 1.5);

			break;
		case SECT_SWAMP:
			heal = dice(12, 10);
		case SECT_WATER:
			heal = dice(16, 10);
			break;
		case SECT_UNDERWATER:
			heal = dice(16, 10);
			break;
		case SECT_CONFLAGRATION:
			heal = 0;
			break;
		case SECT_BURNING:
			heal = 0;
			break;
		default:
			heal = dice(4, 10);
			break;
	}

	if (ch->in_room->area->sky == WeatherCondition::Drizzle
		&& ch->in_room->sector_type != SECT_WATER
		&& ch->in_room->sector_type != SECT_INSIDE
		&& ch->in_room->sector_type != SECT_UNDERWATER)
	{
		heal += dice(4, 10);
	}

	if (victim == ch)
		act("You draw upon the water in your surroundings to revitalize yourself.", ch, 0, victim, TO_CHAR);
	else
		act("You draw upon the water in your surroundings to revitalize $N.", ch, 0, victim, TO_CHAR);

	if (heal == 0)
		act("The flames burn up all moisture around you!", victim, 0, 0, TO_CHAR);
	else if (heal <= 30)
		act("You feel slightly more vigorous as moisture bathes your skin.", victim, 0, 0, TO_CHAR);
	else if (heal <= 80)
		act("A renewed energy surges through your limbs as the healing waters wash over you.", victim, 0, 0, TO_CHAR);
	else
		act("You feel your wounds mending rapidly as the life-giving water fills you with vigor!", victim, 0, 0, TO_CHAR);

	victim->hit = std::min(victim->hit + heal, (int)victim->max_hit);
}